

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O1

bool __thiscall DreamExternalTester::testOptimization(DreamExternalTester *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  
  bVar1 = TasOptimization::testParticleSwarmState(this->verbose);
  bVar2 = TasOptimization::testParticleSwarm(this->verbose);
  *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) = 0x14
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Optimization",0xc);
  *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) = 0x1e
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Particle Swarm",0xe);
  *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) = 0xf;
  pcVar6 = "FAIL";
  pcVar5 = "FAIL";
  if (bVar2) {
    pcVar5 = "Pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  bVar3 = TasOptimization::testGradientDescentState(this->verbose);
  bVar4 = TasOptimization::testGradientDescent(this->verbose);
  *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) = 0x14
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Optimization",0xc);
  *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) = 0x1e
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Gradient Descent",0x10);
  *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) = 0xf;
  if (bVar4) {
    pcVar6 = "Pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return (bVar2 && bVar4) && (bVar3 && bVar1);
}

Assistant:

bool DreamExternalTester::testOptimization(){
    test_result test;

    // Test Particle Swarm State and Algorithm.
    test.tassert(TasOptimization::testParticleSwarmState(verbose));
    test.tassert(TasOptimization::testParticleSwarm(verbose));
    reportPassFail(test.last_success(), "Optimization", "Particle Swarm");

    // Test Gradient Descent State and Algorithm.
    test.tassert(TasOptimization::testGradientDescentState(verbose));
    test.tassert(TasOptimization::testGradientDescent(verbose));
    reportPassFail(test.last_success(), "Optimization", "Gradient Descent");

    return test.success();
}